

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainMakefile2(cmGlobalUnixMakefileGenerator3 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmLocalUnixMakefileGenerator3 *this_00;
  long *plVar2;
  bool bVar3;
  pointer pbVar4;
  pointer pbVar5;
  int iVar6;
  char *pcVar7;
  pointer ppcVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pbVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  string makefileName;
  cmGeneratedFileStream makefileStream;
  
  pcVar7 = cmake::GetHomeOutputDirectory
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)&makefileName,pcVar7,(allocator *)&makefileStream);
  std::__cxx11::string::append((char *)&makefileName);
  std::__cxx11::string::append((char *)&makefileName);
  cmGeneratedFileStream::cmGeneratedFileStream(&makefileStream,makefileName._M_dataplus._M_p,false);
  if (((&makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    this_00 = (cmLocalUnixMakefileGenerator3 *)
              *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    cmLocalUnixMakefileGenerator3::WriteDisclaimer(this_00,(ostream *)&makefileStream);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar1 = &local_2f8.field_2;
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"all","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               &local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"default_target","");
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_00,(ostream *)&makefileStream,
               "Default target executed when no arguments are given to make.",&local_2f8,&depends,
               &no_commands,true,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    pbVar5 = depends.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = depends.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar10 = &(depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar10 + -1))->_M_dataplus)._M_p;
        if (paVar10 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar2) {
          operator_delete(plVar2,paVar10->_M_allocated_capacity + 1);
        }
        pbVar11 = (pointer)(paVar10 + 1);
        paVar10 = paVar10 + 2;
      } while (pbVar11 != pbVar5);
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
    }
    iVar6 = std::__cxx11::string::compare((char *)&this->EmptyRuleHackDepends);
    if (iVar6 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&this->EmptyRuleHackDepends);
    }
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"all","");
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_00,(ostream *)&makefileStream,"The main recursive all target",&local_2f8,
               &depends,&no_commands,true,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"preinstall","");
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_00,(ostream *)&makefileStream,"The main recursive preinstall target",&local_2f8,
               &depends,&no_commands,true,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop(this_00,(ostream *)&makefileStream);
    ppcVar8 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar8) {
      uVar9 = 0;
      uVar12 = 1;
      do {
        WriteConvenienceRules2
                  (this,(ostream *)&makefileStream,(cmLocalUnixMakefileGenerator3 *)ppcVar8[uVar9]);
        ppcVar8 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar12 < (ulong)((long)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator
                                       .LocalGenerators.
                                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar8 >>
                                3);
        uVar9 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar3);
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom
              ((cmLocalUnixMakefileGenerator3 *)*ppcVar8,(ostream *)&makefileStream);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&no_commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&makefileStream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)makefileName._M_dataplus._M_p != &makefileName.field_2) {
    operator_delete(makefileName._M_dataplus._M_p,makefileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainMakefile2()
{
  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string makefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  makefileName += cmake::GetCMakeFilesDirectory();
  makefileName += "/Makefile2";
  cmGeneratedFileStream makefileStream(makefileName.c_str());
  if(!makefileStream)
    {
    return;
    }

  // get a local generator for some useful methods
  cmLocalUnixMakefileGenerator3 *lg =
    static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[0]);

  // Write the do not edit header.
  lg->WriteDisclaimer(makefileStream);

  // Write the main entry point target.  This must be the VERY first
  // target so that make with no arguments will run it.
  // Just depend on the all target to drive the build.
  std::vector<std::string> depends;
  std::vector<std::string> no_commands;
  depends.push_back("all");

  // Write the rule.
  lg->WriteMakeRule(makefileStream,
                    "Default target executed when no arguments are "
                    "given to make.",
                    "default_target",
                    depends,
                    no_commands, true);

  depends.clear();

  // The all and preinstall rules might never have any dependencies
  // added to them.
  if(this->EmptyRuleHackDepends != "")
    {
    depends.push_back(this->EmptyRuleHackDepends);
    }

  // Write and empty all:
  lg->WriteMakeRule(makefileStream,
                    "The main recursive all target", "all",
                    depends, no_commands, true);

  // Write an empty preinstall:
  lg->WriteMakeRule(makefileStream,
                    "The main recursive preinstall target", "preinstall",
                    depends, no_commands, true);

  // Write out the "special" stuff
  lg->WriteSpecialTargetsTop(makefileStream);

  // write the target convenience rules
  unsigned int i;
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    lg =
      static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[i]);
    this->WriteConvenienceRules2(makefileStream,lg);
    }

  lg = static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[0]);
  lg->WriteSpecialTargetsBottom(makefileStream);
}